

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

double ImPlot::PlotHistogram2D<long_long>
                 (char *label_id,longlong *xs,longlong *ys,int count,int x_bins,int y_bins,
                 bool density,ImPlotLimits range,bool outliers)

{
  ImDrawList *pIVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  ImPlotScale IVar6;
  double *pdVar7;
  double dVar8;
  ImPlotPoint IVar9;
  int local_190;
  ImPlotPoint local_170;
  ImPlotPoint local_160;
  TransformerLogLog local_14c;
  ImPlotPoint local_148;
  ImPlotPoint local_138;
  TransformerLinLog local_124;
  ImPlotPoint local_120;
  ImPlotPoint local_110;
  TransformerLogLin local_fc;
  ImPlotPoint local_f8;
  ImPlotPoint local_e8;
  TransformerLinLin local_d4;
  ImDrawList *local_d0;
  ImDrawList *DrawList;
  ImPlotPoint local_b8;
  int local_a4;
  double dStack_a0;
  int b_2;
  double scale;
  int b_1;
  int yb;
  int xb;
  int i;
  double max_count;
  int counted;
  int b;
  ImVector<double> *bin_counts;
  double dStack_68;
  int bins;
  double height;
  double width;
  longlong Max_1;
  longlong Min_1;
  longlong Max;
  longlong Min;
  bool outliers_local;
  int iStack_30;
  bool density_local;
  int y_bins_local;
  int x_bins_local;
  int count_local;
  longlong *ys_local;
  longlong *xs_local;
  char *label_id_local;
  
  Min._3_1_ = density;
  Min._2_1_ = outliers;
  if (((count < 1) || (x_bins == 0)) || (y_bins == 0)) {
    label_id_local = (char *)0x0;
  }
  else {
    Min._4_4_ = y_bins;
    iStack_30 = x_bins;
    y_bins_local = count;
    _x_bins_local = ys;
    ys_local = xs;
    xs_local = (longlong *)label_id;
    if ((range.X.Min == 0.0) && (!NAN(range.X.Min))) {
      if ((range.X.Max == 0.0) && (!NAN(range.X.Max))) {
        ImMinMaxArray<long_long>(xs,count,&Max,&Min_1);
        range.X.Min = (double)Max;
        range.X.Max = (double)Min_1;
      }
    }
    if ((range.Y.Min == 0.0) && (!NAN(range.Y.Min))) {
      if ((range.Y.Max == 0.0) && (!NAN(range.Y.Max))) {
        ImMinMaxArray<long_long>(_x_bins_local,y_bins_local,&Max_1,(longlong *)&width);
      }
    }
    if (iStack_30 < 0) {
      CalculateBins<long_long>
                (ys_local,y_bins_local,iStack_30,&range.X,&stack0xffffffffffffffd0,&height);
    }
    else {
      dVar8 = ImPlotRange::Size(&range.X);
      height = dVar8 / (double)iStack_30;
    }
    if (Min._4_4_ < 0) {
      CalculateBins<long_long>
                (_x_bins_local,y_bins_local,Min._4_4_,&range.Y,(int *)((long)&Min + 4),
                 &stack0xffffffffffffff98);
    }
    else {
      dStack_68 = ImPlotRange::Size(&range.Y);
      dStack_68 = dStack_68 / (double)Min._4_4_;
    }
    bin_counts._4_4_ = iStack_30 * Min._4_4_;
    _counted = &GImPlot->Temp1;
    ImVector<double>::resize(_counted,bin_counts._4_4_);
    for (max_count._4_4_ = 0; max_count._4_4_ < bin_counts._4_4_;
        max_count._4_4_ = max_count._4_4_ + 1) {
      pdVar7 = ImVector<double>::operator[](_counted,max_count._4_4_);
      *pdVar7 = 0.0;
    }
    max_count._0_4_ = 0;
    _xb = (char *)0x0;
    for (yb = 0; yb < y_bins_local; yb = yb + 1) {
      bVar5 = ImPlotLimits::Contains(&range,(double)ys_local[yb],(double)_x_bins_local[yb]);
      if (bVar5) {
        b_1 = ImClamp<int>((int)(((double)ys_local[yb] - range.X.Min) / height),0,iStack_30 + -1);
        scale._4_4_ = ImClamp<int>((int)(((double)_x_bins_local[yb] - range.Y.Min) / dStack_68),0,
                                   Min._4_4_ + -1);
        scale._0_4_ = scale._4_4_ * iStack_30 + b_1;
        pdVar7 = ImVector<double>::operator[](_counted,scale._0_4_);
        *pdVar7 = *pdVar7 + 1.0;
        pdVar7 = ImVector<double>::operator[](_counted,scale._0_4_);
        if ((double)_xb < *pdVar7) {
          pdVar7 = ImVector<double>::operator[](_counted,scale._0_4_);
          _xb = (char *)*pdVar7;
        }
        max_count._0_4_ = max_count._0_4_ + 1;
      }
    }
    if ((Min._3_1_ & 1) != 0) {
      if ((Min._2_1_ & 1) == 0) {
        local_190 = max_count._0_4_;
      }
      else {
        local_190 = y_bins_local;
      }
      dStack_a0 = 1.0 / ((double)local_190 * height * dStack_68);
      for (local_a4 = 0; dVar8 = dStack_a0, local_a4 < bin_counts._4_4_; local_a4 = local_a4 + 1) {
        pdVar7 = ImVector<double>::operator[](_counted,local_a4);
        *pdVar7 = dVar8 * *pdVar7;
      }
      _xb = (char *)(dStack_a0 * (double)_xb);
    }
    bVar5 = BeginItem((char *)xs_local,-1);
    if (bVar5) {
      bVar5 = FitThisFrame();
      if (bVar5) {
        local_b8 = ImPlotLimits::Min(&range);
        FitPoint(&local_b8);
        _DrawList = ImPlotLimits::Max(&range);
        FitPoint((ImPlotPoint *)&DrawList);
      }
      local_d0 = GetPlotDrawList();
      IVar6 = GetCurrentScale();
      switch(IVar6) {
      case 0:
        TransformerLinLin::TransformerLinLin(&local_d4);
        iVar4 = iStack_30;
        iVar3 = Min._4_4_;
        pcVar2 = _xb;
        pIVar1 = local_d0;
        pdVar7 = _counted->Data;
        local_e8 = ImPlotLimits::Min(&range);
        IVar9 = ImPlotLimits::Max(&range);
        local_f8.y = IVar9.y;
        local_f8.x = IVar9.x;
        RenderHeatmap<double,ImPlot::TransformerLinLin>
                  (local_d4,pIVar1,pdVar7,iVar3,iVar4,0.0,(double)pcVar2,(char *)0x0,&local_e8,
                   &local_f8,false);
        break;
      case 1:
        TransformerLogLin::TransformerLogLin(&local_fc);
        iVar4 = iStack_30;
        iVar3 = Min._4_4_;
        pcVar2 = _xb;
        pIVar1 = local_d0;
        pdVar7 = _counted->Data;
        local_110 = ImPlotLimits::Min(&range);
        IVar9 = ImPlotLimits::Max(&range);
        local_120.y = IVar9.y;
        local_120.x = IVar9.x;
        RenderHeatmap<double,ImPlot::TransformerLogLin>
                  (local_fc,pIVar1,pdVar7,iVar3,iVar4,0.0,(double)pcVar2,(char *)0x0,&local_110,
                   &local_120,false);
        break;
      case 2:
        TransformerLinLog::TransformerLinLog(&local_124);
        iVar4 = iStack_30;
        iVar3 = Min._4_4_;
        pcVar2 = _xb;
        pIVar1 = local_d0;
        pdVar7 = _counted->Data;
        local_138 = ImPlotLimits::Min(&range);
        IVar9 = ImPlotLimits::Max(&range);
        local_148.y = IVar9.y;
        local_148.x = IVar9.x;
        RenderHeatmap<double,ImPlot::TransformerLinLog>
                  (local_124,pIVar1,pdVar7,iVar3,iVar4,0.0,(double)pcVar2,(char *)0x0,&local_138,
                   &local_148,false);
        break;
      case 3:
        TransformerLogLog::TransformerLogLog(&local_14c);
        iVar4 = iStack_30;
        iVar3 = Min._4_4_;
        pcVar2 = _xb;
        pIVar1 = local_d0;
        pdVar7 = _counted->Data;
        local_160 = ImPlotLimits::Min(&range);
        IVar9 = ImPlotLimits::Max(&range);
        local_170.y = IVar9.y;
        local_170.x = IVar9.x;
        RenderHeatmap<double,ImPlot::TransformerLogLog>
                  (local_14c,pIVar1,pdVar7,iVar3,iVar4,0.0,(double)pcVar2,(char *)0x0,&local_160,
                   &local_170,false);
      }
      EndItem();
    }
    label_id_local = _xb;
  }
  return (double)label_id_local;
}

Assistant:

double PlotHistogram2D(const char* label_id, const T* xs, const T* ys, int count, int x_bins, int y_bins, bool density, ImPlotLimits range, bool outliers) {

    if (count <= 0 || x_bins == 0 || y_bins == 0)
        return 0;

    if (range.X.Min == 0 && range.X.Max == 0) {
        T Min, Max;
        ImMinMaxArray(xs, count, &Min, &Max);
        range.X.Min = (double)Min;
        range.X.Max = (double)Max;
    }
    if (range.Y.Min == 0 && range.Y.Max == 0) {
        T Min, Max;
        ImMinMaxArray(ys, count, &Min, &Max);
        range.Y.Min = (double)Min;
        range.Y.Max = (double)Max;
    }

    double width, height;
    if (x_bins < 0)
        CalculateBins(xs, count, x_bins, range.X, x_bins, width);
    else
        width = range.X.Size() / x_bins;
    if (y_bins < 0)
        CalculateBins(ys, count, y_bins, range.Y, y_bins, height);
    else
        height = range.Y.Size() / y_bins;

    const int bins = x_bins * y_bins;

    ImVector<double>& bin_counts = GImPlot->Temp1;
    bin_counts.resize(bins);

    for (int b = 0; b < bins; ++b)
        bin_counts[b] = 0;

    int counted = 0;
    double max_count = 0;
    for (int i = 0; i < count; ++i) {
        if (range.Contains((double)xs[i], (double)ys[i])) {
            const int xb = ImClamp( (int)((double)(xs[i] - range.X.Min) / width)  , 0, x_bins - 1);
            const int yb = ImClamp( (int)((double)(ys[i] - range.Y.Min) / height) , 0, y_bins - 1);
            const int b  = yb * x_bins + xb;
            bin_counts[b] += 1.0;
            if (bin_counts[b] > max_count)
                max_count = bin_counts[b];
            counted++;
        }
    }
    if (density) {
        double scale = 1.0 / ((outliers ? count : counted) * width * height);
        for (int b = 0; b < bins; ++b)
            bin_counts[b] *= scale;
        max_count *= scale;
    }

    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            FitPoint(range.Min());
            FitPoint(range.Max());
        }
        ImDrawList& DrawList = *GetPlotDrawList();
        switch (GetCurrentScale()) {
            case ImPlotScale_LinLin: RenderHeatmap(TransformerLinLin(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
            case ImPlotScale_LogLin: RenderHeatmap(TransformerLogLin(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
            case ImPlotScale_LinLog: RenderHeatmap(TransformerLinLog(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
            case ImPlotScale_LogLog: RenderHeatmap(TransformerLogLog(), DrawList, &bin_counts.Data[0], y_bins, x_bins, 0, max_count, NULL, range.Min(), range.Max(), false); break;
        }
        EndItem();
    }
    return max_count;
}